

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wildmidi_lib.cpp
# Opt level: O2

int * WM_Mix(midi *handle,int *buffer,unsigned_long count)

{
  double (*padVar1) [58];
  short sVar2;
  uint uVar3;
  _note *p_Var4;
  int iVar5;
  double *pdVar6;
  _note *p_Var7;
  byte bVar8;
  uint uVar9;
  long lVar10;
  long lVar11;
  _note *p_Var12;
  _note *p_Var13;
  _sample *p_Var14;
  byte bVar15;
  ulong uVar16;
  _note **pp_Var17;
  uint uVar18;
  short *psVar19;
  int iVar20;
  uint uVar21;
  ulong uVar22;
  int iVar23;
  uint uVar24;
  long lVar25;
  double *pdVar26;
  double (*padVar27) [58];
  _note **pp_Var28;
  double dVar29;
  double dVar30;
  int iVar31;
  double dVar32;
  int iVar33;
  int iVar34;
  double local_1a0;
  double adStack_148 [35];
  
  if ((*(byte *)((long)handle + 0x30) & 2) == 0) {
    pp_Var28 = (_note **)((long)handle + 0x348);
    do {
      p_Var7 = *pp_Var28;
      iVar33 = 0;
      iVar34 = 0;
      while (p_Var7 != (_note *)0x0) {
        uVar9 = p_Var7->sample_pos;
        p_Var14 = p_Var7->sample;
        iVar20 = (int)p_Var14->data[uVar9 >> 10];
        uVar16 = (long)(((int)((uVar9 & 0x3ff) * (p_Var14->data[(ulong)(uVar9 >> 10) + 1] - iVar20))
                         / 0x400 + iVar20) * (p_Var7->env_level >> 0xc)) / 0x400;
        uVar22._0_4_ = p_Var7->left_mix_volume;
        uVar22._4_4_ = p_Var7->right_mix_volume;
        uVar9 = uVar9 + p_Var7->sample_inc;
        p_Var7->sample_pos = uVar9;
        bVar15 = p_Var7->modes;
        if ((bVar15 & 4) == 0) {
          if (uVar9 < p_Var14->data_length) goto LAB_00385045;
          goto switchD_0038508e_caseD_6;
        }
        if (p_Var14->loop_end < uVar9) {
          p_Var7->sample_pos =
               (uVar9 - p_Var14->loop_start) % p_Var14->loop_size + p_Var14->loop_start;
        }
LAB_00385045:
        iVar20 = p_Var7->env_inc;
        if (iVar20 == 0) goto LAB_00385146;
        iVar23 = p_Var7->env_level + iVar20;
        p_Var7->env_level = iVar23;
        bVar8 = p_Var7->env;
        iVar31 = p_Var14->env_target[bVar8];
        if (iVar20 < 0) {
          if (iVar23 <= iVar31) goto LAB_0038507b;
          goto LAB_00385146;
        }
        if (iVar23 < iVar31) goto LAB_00385146;
LAB_0038507b:
        p_Var7->env_level = iVar31;
        switch(bVar8) {
        case 0:
          if ((bVar15 & 0x40) == 0) {
LAB_00385140:
            p_Var7->env_inc = 0;
            goto LAB_00385146;
          }
        default:
switchD_0038508e_caseD_1:
          bVar8 = bVar8 + 1;
          p_Var7->env = bVar8;
          if (p_Var7->is_off == '\x01') {
            do_note_off_extra(p_Var7);
            iVar31 = p_Var7->env_level;
            p_Var14 = p_Var7->sample;
            bVar8 = p_Var7->env;
          }
          iVar20 = -p_Var14->env_rate[bVar8];
          if (iVar31 <= p_Var14->env_target[bVar8]) {
            iVar20 = p_Var14->env_rate[bVar8];
          }
          p_Var7->env_inc = iVar20;
LAB_00385146:
          p_Var7 = p_Var7->next;
          break;
        case 2:
          if ((bVar15 & 0x20) != 0) goto LAB_00385140;
          if (-1 < (char)bVar15) goto switchD_0038508e_caseD_1;
          p_Var7->env = '\x05';
          iVar20 = -p_Var14->env_rate[5];
          if (iVar31 <= p_Var14->env_target[5]) {
            iVar20 = p_Var14->env_rate[5];
          }
          p_Var7->env_inc = iVar20;
          break;
        case 5:
          if (iVar31 != 0) {
            if ((bVar15 & 4) != 0) {
              p_Var7->modes = bVar15 & 0xfb;
            }
            goto LAB_00385140;
          }
        case 6:
switchD_0038508e_caseD_6:
          p_Var13 = p_Var7->replay;
          p_Var7->active = '\0';
          p_Var4 = *pp_Var28;
          if (p_Var13 == (_note *)0x0) {
            if (p_Var4 == p_Var7) {
              p_Var7 = p_Var7->next;
              *pp_Var28 = p_Var7;
            }
            else {
              do {
                p_Var13 = p_Var4;
                p_Var4 = p_Var13->next;
                if (p_Var4 == p_Var7) break;
              } while (p_Var4 != (_note *)0x0);
              p_Var7 = p_Var7->next;
              p_Var13->next = p_Var7;
            }
          }
          else {
            pp_Var17 = pp_Var28;
            if (p_Var4 != p_Var7) {
              do {
                p_Var12 = p_Var4;
                p_Var4 = p_Var12->next;
              } while (p_Var4 != p_Var7);
              pp_Var17 = &p_Var12->next;
            }
            *pp_Var17 = p_Var13;
            p_Var13->next = p_Var7->next;
            p_Var13->active = '\x01';
            p_Var7 = p_Var13;
          }
        }
        iVar31 = (int)((uVar22 >> 0x20) * (uVar16 & 0xffffffff));
        iVar20 = (int)((uVar16 & 0xffffffff) * (uVar22 & 0xffffffff));
        iVar33 = iVar33 + ((int)(((uint)(iVar20 >> 0x1f) >> 0x16) + iVar20) >> 10);
        iVar34 = iVar34 + ((int)(((uint)(iVar31 >> 0x1f) >> 0x16) + iVar31) >> 10);
      }
      *buffer = iVar33;
      buffer[1] = iVar34;
      buffer = buffer + 2;
      count = count - 1;
    } while (count != 0);
  }
  else {
    if (gauss_table == (double *)0x0) {
      FCriticalSection::Enter(&gauss_lock);
      pdVar6 = gauss_table;
      if (gauss_table == (double *)0x0) {
        newt_coeffs[0][0] = 1.0;
        lVar10 = 0x88f4f0;
        padVar27 = newt_coeffs;
        for (uVar16 = 0; uVar16 != 0x23; uVar16 = uVar16 + 1) {
          padVar1 = newt_coeffs + uVar16;
          newt_coeffs[uVar16][0] = 1.0;
          (*padVar1)[uVar16] = 1.0;
          if (1 < uVar16) {
            dVar32 = newt_coeffs[uVar16 - 1][0] / (double)(int)uVar16;
            (*padVar1)[0] = dVar32;
            (*padVar1)[uVar16] = dVar32;
          }
          dVar32 = (double)(int)uVar16;
          for (uVar22 = 1; uVar22 < uVar16; uVar22 = uVar22 + 1) {
            *(double *)(lVar10 + 0x1d0 + uVar22 * 8) =
                 (*(double *)(lVar10 + uVar22 * 8) + *(double *)(lVar10 + -8 + uVar22 * 8)) *
                 (1.0 / dVar32);
          }
          adStack_148[uVar16] = dVar32 * 0.07957747154594767;
          lVar10 = lVar10 + 0x1d0;
        }
        lVar10 = 1;
        for (uVar16 = 0; uVar16 != 0x23; uVar16 = uVar16 + 1) {
          dVar32 = (double)__powidf2(0xbff0000000000000,uVar16 & 0xffffffff);
          iVar33 = (int)dVar32;
          for (lVar11 = 0; lVar10 != lVar11; lVar11 = lVar11 + 1) {
            (*padVar27)[lVar11] = (double)iVar33 * (*padVar27)[lVar11];
            iVar33 = -iVar33;
          }
          lVar10 = lVar10 + 1;
          padVar27 = padVar27 + 1;
        }
        pdVar6 = (double *)malloc(0x46000);
        local_1a0 = 0.0;
        for (lVar10 = 0; lVar10 != 0x400; lVar10 = lVar10 + 1) {
          pdVar26 = pdVar6 + lVar10 * 0x23;
          for (lVar11 = 0; lVar11 != 0x23; lVar11 = lVar11 + 1) {
            dVar32 = 1.0;
            for (lVar25 = 0; lVar25 != 0x23; lVar25 = lVar25 + 1) {
              if (lVar11 != lVar25) {
                dVar30 = adStack_148[lVar25];
                dVar29 = sin((local_1a0 * 0.07957747154594767 + 1.3528170162811104) - dVar30);
                dVar30 = sin(adStack_148[lVar11] - dVar30);
                dVar32 = (dVar29 * dVar32) / dVar30;
              }
            }
            *pdVar26 = dVar32;
            pdVar26 = pdVar26 + 1;
          }
          local_1a0 = local_1a0 + 0.0009765625;
        }
      }
      gauss_table = pdVar6;
      FCriticalSection::Leave(&gauss_lock);
    }
    pp_Var28 = (_note **)((long)handle + 0x348);
    do {
      p_Var7 = *pp_Var28;
      iVar33 = 0;
      iVar34 = 0;
      while (p_Var7 != (_note *)0x0) {
        uVar9 = p_Var7->sample_pos;
        uVar18 = uVar9 >> 10;
        p_Var14 = p_Var7->sample;
        uVar3 = p_Var14->data_length;
        uVar24 = (~uVar18 + (uVar3 >> 10)) * 2;
        if ((int)uVar24 < 3) {
          uVar24 = 2;
        }
        uVar21 = uVar9 >> 9 | 1;
        if (uVar24 - 1 < uVar21) {
          uVar21 = uVar24 - 1;
        }
        if (uVar21 < 0x22) {
          psVar19 = (short *)((long)p_Var14->data +
                             (long)(int)-(uVar21 >> 1) * 2 + (ulong)(uVar18 * 2));
          uVar22 = (ulong)(uVar18 * 2) + 1;
          uVar16 = (ulong)uVar24 - 1;
          if (uVar22 < (ulong)uVar24 - 1) {
            uVar16 = uVar22;
          }
          padVar27 = newt_coeffs + uVar16;
          dVar32 = 0.0;
          while (uVar16 != 0) {
            for (lVar10 = 0; lVar10 <= (long)uVar16; lVar10 = lVar10 + 1) {
              dVar32 = dVar32 + (double)(int)psVar19[lVar10] * (*padVar27)[lVar10];
            }
            dVar32 = dVar32 * (((double)(uVar21 >> 1) + (double)(uVar9 & 0x3ff) * 0.0009765625) -
                              (double)(int)(uVar16 - 1));
            padVar27 = padVar27 + -1;
            uVar16 = uVar16 - 1;
          }
          dVar32 = dVar32 + (double)(int)*psVar19;
        }
        else {
          psVar19 = p_Var14->data + ((ulong)uVar18 - 0x11);
          dVar32 = 0.0;
          uVar16 = 0xfffffffffffffff8;
          do {
            sVar2 = *psVar19;
            psVar19 = psVar19 + 1;
            dVar32 = dVar32 + (double)(int)sVar2 *
                              *(double *)
                               ((long)gauss_table + uVar16 + (ulong)((uVar9 & 0x3ff) * 0x118) + 8);
            uVar16 = uVar16 + 8;
          } while (uVar16 < 0x109);
        }
        iVar20 = p_Var7->env_level;
        uVar9 = uVar9 + p_Var7->sample_inc;
        uVar16._0_4_ = p_Var7->left_mix_volume;
        uVar16._4_4_ = p_Var7->right_mix_volume;
        p_Var7->sample_pos = uVar9;
        if (p_Var14->loop_end < uVar9) {
          if ((p_Var7->modes & 4) != 0) {
            p_Var7->sample_pos =
                 (uVar9 - p_Var14->loop_start) % p_Var14->loop_size + p_Var14->loop_start;
            goto LAB_00385631;
          }
          if (uVar9 < uVar3) goto LAB_00385631;
          goto switchD_00385680_caseD_6;
        }
LAB_00385631:
        iVar31 = p_Var7->env_inc;
        if (iVar31 == 0) goto LAB_00385730;
        iVar23 = iVar31 + iVar20;
        p_Var7->env_level = iVar23;
        bVar15 = p_Var7->env;
        iVar5 = p_Var14->env_target[bVar15];
        if (iVar31 < 0) {
          if (iVar23 <= iVar5) goto LAB_00385666;
          goto LAB_00385730;
        }
        if (iVar23 < iVar5) goto LAB_00385730;
LAB_00385666:
        p_Var7->env_level = iVar5;
        switch(bVar15) {
        case 0:
          if ((p_Var7->modes & 0x40) == 0) {
LAB_0038572a:
            p_Var7->env_inc = 0;
            goto LAB_00385730;
          }
        default:
switchD_00385680_caseD_1:
          bVar15 = bVar15 + 1;
          p_Var7->env = bVar15;
          if (p_Var7->is_off == '\x01') {
            do_note_off_extra(p_Var7);
            iVar5 = p_Var7->env_level;
            p_Var14 = p_Var7->sample;
            bVar15 = p_Var7->env;
          }
          iVar31 = -p_Var14->env_rate[bVar15];
          if (iVar5 <= p_Var14->env_target[bVar15]) {
            iVar31 = p_Var14->env_rate[bVar15];
          }
          p_Var7->env_inc = iVar31;
LAB_00385730:
          p_Var7 = p_Var7->next;
          break;
        case 2:
          if ((p_Var7->modes & 0x20) != 0) goto LAB_0038572a;
          if (-1 < (char)p_Var7->modes) goto switchD_00385680_caseD_1;
          p_Var7->env = '\x05';
          iVar31 = -p_Var14->env_rate[5];
          if (iVar5 <= p_Var14->env_target[5]) {
            iVar31 = p_Var14->env_rate[5];
          }
          p_Var7->env_inc = iVar31;
          break;
        case 5:
          if (iVar5 != 0) {
            if ((p_Var7->modes & 4) != 0) {
              p_Var7->modes = p_Var7->modes & 0xfb;
            }
            goto LAB_0038572a;
          }
        case 6:
switchD_00385680_caseD_6:
          p_Var13 = p_Var7->replay;
          p_Var7->active = '\0';
          p_Var4 = *pp_Var28;
          if (p_Var13 == (_note *)0x0) {
            if (p_Var4 == p_Var7) {
              p_Var7 = p_Var7->next;
              *pp_Var28 = p_Var7;
            }
            else {
              do {
                p_Var13 = p_Var4;
                p_Var4 = p_Var13->next;
                if (p_Var4 == p_Var7) break;
              } while (p_Var4 != (_note *)0x0);
              p_Var7 = p_Var7->next;
              p_Var13->next = p_Var7;
            }
          }
          else {
            pp_Var17 = pp_Var28;
            if (p_Var4 != p_Var7) {
              do {
                p_Var12 = p_Var4;
                p_Var4 = p_Var12->next;
              } while (p_Var4 != p_Var7);
              pp_Var17 = &p_Var12->next;
            }
            *pp_Var17 = p_Var13;
            p_Var13->next = p_Var7->next;
            p_Var13->active = '\x01';
            p_Var7 = p_Var13;
          }
        }
        uVar9 = (uint)(dVar32 * 0.0009765625 * (double)(iVar20 >> 0xc));
        iVar20 = (int)((uVar16 >> 0x20) * (ulong)uVar9);
        iVar31 = (int)((uVar16 & 0xffffffff) * (ulong)uVar9);
        iVar33 = iVar33 + ((int)(((uint)(iVar31 >> 0x1f) >> 0x16) + iVar31) >> 10);
        iVar34 = iVar34 + ((int)(((uint)(iVar20 >> 0x1f) >> 0x16) + iVar20) >> 10);
      }
      *buffer = iVar33;
      buffer[1] = iVar34;
      buffer = buffer + 2;
      count = count - 1;
    } while (count != 0);
  }
  return buffer;
}

Assistant:

int *WM_Mix(midi *handle, int *buffer, unsigned long count)
{
	if (((struct _mdi *)handle)->info.mixer_options & WM_MO_ENHANCED_RESAMPLING)
	{
		return WM_Mix_Gauss(handle, buffer, count);
	}
	else
	{
		return WM_Mix_Linear(handle, buffer, count);
	}
}